

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void readDFA(string *fileName,adjacencyType *adjVec,int *numOfStates,
            vector<edge,_std::allocator<edge>_> *newEdges)

{
  char cVar1;
  char delim;
  string curString;
  ifstream fileStream;
  string local_268;
  undefined1 local_248 [32];
  long local_228 [65];
  
  anon_unknown.dwarf_29a00::openFile((anon_unknown_dwarf_29a00 *)local_228,fileName);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_248,"[0-9]+",0x10);
  anon_unknown.dwarf_29a00::skipUntilRegex(&local_268,(ifstream *)local_228,(regex *)local_248);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_248);
  anon_unknown.dwarf_29a00::split
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_248,&local_268,delim);
  *numOfStates = (int)((ulong)(local_248._8_8_ - local_248._0_8_) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  cVar1 = std::ios::widen((char)(ifstream *)local_228 + (char)*(undefined8 *)(local_228[0] + -0x18))
  ;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_228,(string *)&local_268,cVar1);
  anon_unknown.dwarf_29a00::readEdges((ifstream *)local_228,adjVec,*numOfStates,&local_268,newEdges)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void readDFA(const string & fileName,
             adjacencyType & adjVec,
             int & numOfStates,
             vector<edge> & newEdges)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());
    getline(fileStream, curString);

    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, newEdges);
}